

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_zeors_Test::~FastPForTest_fastpack_zeors_Test
          (FastPForTest_fastpack_zeors_Test *this)

{
  void *in_RDI;
  
  ~FastPForTest_fastpack_zeors_Test((FastPForTest_fastpack_zeors_Test *)0x12e408);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_zeors) {
    in32.clear();
    for (int i = 0; i < 256; ++i) {
      in32.push_back(0);
    }
    _verify();
    _copy64();
    _verify64();
  }